

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O1

CImg<unsigned_int> * __thiscall
cimg_library::CImg<unsigned_int>::fill(CImg<unsigned_int> *this,uint val)

{
  uint *__s;
  undefined4 in_EAX;
  undefined4 uVar1;
  uint uVar2;
  uint *puVar3;
  undefined1 auVar4 [16];
  
  __s = this->_data;
  if (__s != (uint *)0x0) {
    auVar4._0_4_ = -(uint)(this->_width == 0);
    auVar4._4_4_ = -(uint)(this->_height == 0);
    auVar4._8_4_ = -(uint)(this->_depth == 0);
    auVar4._12_4_ = -(uint)(this->_spectrum == 0);
    uVar1 = movmskps(in_EAX,auVar4);
    if ((char)uVar1 == '\0') {
      uVar2 = this->_depth * this->_height * this->_width * this->_spectrum;
      if (val == 0) {
        memset(__s,0,(ulong)uVar2 << 2);
      }
      else if (uVar2 != 0) {
        puVar3 = __s + uVar2;
        do {
          puVar3[-1] = val;
          puVar3 = puVar3 + -1;
        } while (__s < puVar3);
      }
    }
  }
  return this;
}

Assistant:

CImg<T>& fill(const T val) {
      if (is_empty()) return *this;
      if (val && sizeof(T)!=1) cimg_for(*this,ptrd,T) *ptrd = val;
      else std::memset(_data,(int)val,size()*sizeof(T));
      return *this;
    }